

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckCudaOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  int iVar1;
  cmCTest *pcVar2;
  pointer piVar3;
  pointer piVar4;
  size_type sVar5;
  pointer puVar6;
  pointer pRVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ostream *poVar12;
  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
  this_00;
  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
  _Var14;
  ulong uVar15;
  long lVar16;
  anon_class_8_1_898e5cf2_for__M_pred match_predicate;
  anon_class_8_1_898e5cf2_for__M_pred __pred;
  ulong uVar17;
  pointer puVar18;
  initializer_list<cmsys::RegularExpression> __l;
  initializer_list<cmsys::RegularExpression> __l_00;
  ulong local_dc0;
  cmDuration local_db8 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonMemcheckOutput;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> matchers;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
  false_positive_matchers;
  ostringstream ostr;
  RegularExpression leakExpr;
  RegularExpression memcheckLine;
  ostringstream cmCTestLog_msg;
  RegularExpression local_920;
  RegularExpression local_850;
  RegularExpression local_780;
  RegularExpression local_6b0;
  RegularExpression local_5e0;
  RegularExpression local_510;
  RegularExpression local_440;
  RegularExpression local_370;
  RegularExpression local_2a0;
  RegularExpression local_1d0;
  RegularExpression local_100;
  size_type sVar13;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::SystemTools::Split(str,&lines);
  lVar11 = std::__cxx11::string::find((char *)str,0x5fce1f);
  iVar1 = (this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
  log->_M_string_length = 0;
  *(log->_M_dataplus)._M_p = '\0';
  cmsys::RegularExpression::RegularExpression(&memcheckLine,"^========");
  cmsys::RegularExpression::RegularExpression(&leakExpr,"== Leaked [0-9,]+ bytes at");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&cmCTestLog_msg,"== Malloc/Free error encountered: (.*)");
  cmsys::RegularExpression::RegularExpression
            (&local_920,"== Program hit error ([^ ]*).* on CUDA API call to");
  cmsys::RegularExpression::RegularExpression
            (&local_850,"== Program hit ([^ ]*).* on CUDA API call to");
  cmsys::RegularExpression::RegularExpression(&local_780,"== (Invalid .*) of size [0-9,]+");
  cmsys::RegularExpression::RegularExpression(&local_6b0,"== (Fatal UVM [CG]PU fault)");
  cmsys::RegularExpression::RegularExpression(&local_5e0,"== .* (Potential .* hazard detected)");
  cmsys::RegularExpression::RegularExpression(&local_510,"== .* (Race reported)");
  cmsys::RegularExpression::RegularExpression(&local_440,"== (Barrier error)");
  cmsys::RegularExpression::RegularExpression(&local_370,"== (Uninitialized .* memory read)");
  cmsys::RegularExpression::RegularExpression(&local_2a0,"== (Unused memory)");
  cmsys::RegularExpression::RegularExpression(&local_1d0,"== (Host API memory access error)");
  cmsys::RegularExpression::RegularExpression(&local_100,"== ([A-Z][a-z].*)");
  __l._M_len = 0xc;
  __l._M_array = (iterator)&cmCTestLog_msg;
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (&matchers,__l,(allocator_type *)local_db8);
  lVar16 = 0x8f0;
  do {
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)(&cmCTestLog_msg + lVar16));
    lVar16 = lVar16 + -0xd0;
  } while (lVar16 != -0xd0);
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&cmCTestLog_msg,"== Error: No attachable process found.*timed-out"
            );
  cmsys::RegularExpression::RegularExpression
            (&local_920,"== Default timeout can be adjusted with --launch-timeout");
  cmsys::RegularExpression::RegularExpression
            (&local_850,"== Error: Target application terminated before first instrumented API");
  cmsys::RegularExpression::RegularExpression
            (&local_780,"== Tracking kernels launched by child processes requires");
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&cmCTestLog_msg;
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (&false_positive_matchers,__l_00,(allocator_type *)local_db8);
  lVar16 = 0x270;
  do {
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)(&cmCTestLog_msg + lVar16));
    lVar16 = lVar16 + -0xd0;
  } while (lVar16 != -0xd0);
  nonMemcheckOutput.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nonMemcheckOutput.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nonMemcheckOutput.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar16 = std::chrono::_V2::steady_clock::now();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar12 = std::operator<<((ostream *)&cmCTestLog_msg,"Start test: ");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::endl<char,std::char_traits<char>>(poVar12);
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  iVar10 = 0;
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x4a7,(char *)local_db8[0].__r,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  std::__cxx11::string::~string((string *)local_db8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  uVar15 = 0;
  for (local_dc0 = 0;
      puVar6 = nonMemcheckOutput.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish,
      local_dc0 <
      (ulong)((long)lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5); local_dc0 = local_dc0 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar12 = std::operator<<((ostream *)&cmCTestLog_msg,"test line ");
    poVar12 = std::operator<<(poVar12,(string *)
                                      (lines.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + local_dc0));
    std::endl<char,std::char_traits<char>>(poVar12);
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x4ab,(char *)local_db8[0].__r,
                 (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
    std::__cxx11::string::~string((string *)local_db8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar8 = cmsys::RegularExpression::find
                      (&memcheckLine,
                       lines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_dc0);
    if (bVar8) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar12 = std::operator<<((ostream *)&cmCTestLog_msg,"cuda sanitizer line ");
      poVar12 = std::operator<<(poVar12,(string *)
                                        (lines.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + local_dc0));
      std::endl<char,std::char_traits<char>>(poVar12);
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x4b0,(char *)local_db8[0].__r,
                   (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
      std::__cxx11::string::~string((string *)local_db8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      __pred.line = lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + local_dc0;
      bVar8 = cmsys::RegularExpression::find(&leakExpr,__pred.line);
      if (bVar8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg,"Memory leak",(allocator<char> *)local_db8);
        sVar13 = FindOrAddWarning(this,(string *)&cmCTestLog_msg);
        uVar9 = (uint)sVar13;
LAB_001a4375:
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        if (-1 < (int)uVar9) {
          poVar12 = std::operator<<((ostream *)&ostr,"<b>");
          uVar17 = (ulong)(uVar9 & 0x7fffffff);
          poVar12 = std::operator<<(poVar12,(string *)
                                            ((this->ResultStrings).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar17));
          std::operator<<(poVar12,"</b> ");
          piVar3 = (results->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4 = (results->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if ((piVar3 == piVar4) || (((long)piVar4 - (long)piVar3 >> 2) - 1U < uVar17)) {
            _cmCTestLog_msg = 1;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (results,(int *)&cmCTestLog_msg);
          }
          else {
            piVar3[uVar17] = piVar3[uVar17] + 1;
          }
          iVar10 = iVar10 + 1;
        }
      }
      else {
        this_00 = std::
                  find_if<__gnu_cxx::__normal_iterator<cmsys::RegularExpression*,std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>>,cmCTestMemCheckHandler::ProcessMemCheckCudaOutput(std::__cxx11::string_const&,std::__cxx11::string&,std::vector<int,std::allocator<int>>&)::__0>
                            ((__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                              )matchers.
                               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                             (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                              )matchers.
                               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                               ._M_impl.super__Vector_impl_data._M_finish,__pred);
        pRVar7 = false_positive_matchers.
                 super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (this_00._M_current !=
            matchers.
            super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          _Var14 = std::
                   find_if<__gnu_cxx::__normal_iterator<cmsys::RegularExpression*,std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>>,cmCTestMemCheckHandler::ProcessMemCheckCudaOutput(std::__cxx11::string_const&,std::__cxx11::string&,std::vector<int,std::allocator<int>>&)::__0>
                             ((__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                               )false_positive_matchers.
                                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                              (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                               )false_positive_matchers.
                                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                                ._M_impl.super__Vector_impl_data._M_finish,__pred);
          if (_Var14._M_current == pRVar7) {
            cmsys::RegularExpressionMatch::match_abi_cxx11_
                      ((string *)&cmCTestLog_msg,&(this_00._M_current)->regmatch,1);
            sVar13 = FindOrAddWarning(this,(string *)&cmCTestLog_msg);
            uVar9 = (uint)sVar13;
            goto LAB_001a4375;
          }
        }
      }
      sVar5 = lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_dc0]._M_string_length;
      poVar12 = std::operator<<((ostream *)&ostr,
                                (string *)
                                (lines.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + local_dc0));
      std::endl<char,std::char_traits<char>>(poVar12);
      uVar15 = uVar15 + sVar5;
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&nonMemcheckOutput,&local_dc0);
    }
  }
  puVar18 = nonMemcheckOutput.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (puVar18 == puVar6) goto LAB_001a4563;
    uVar15 = uVar15 + lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[*puVar18]._M_string_length;
    poVar12 = std::operator<<((ostream *)&ostr,
                              (string *)
                              (lines.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + *puVar18));
    std::endl<char,std::char_traits<char>>(poVar12);
    puVar18 = puVar18 + 1;
  } while (uVar15 <= (ulong)(long)(this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize
           || (lVar11 != -1 || iVar1 == 0));
  std::operator<<((ostream *)&ostr,"....\n");
  std::operator<<((ostream *)&ostr,
                  "Test Output for this test has been truncated see testing machine logs for full output,\n"
                 );
  std::operator<<((ostream *)&ostr,"or put CTEST_FULL_OUTPUT in the output of this test program.\n")
  ;
LAB_001a4563:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar12 = std::operator<<((ostream *)&cmCTestLog_msg,"End test (elapsed: ");
  lVar11 = std::chrono::_V2::steady_clock::now();
  local_db8[0].__r = (double)(lVar11 - lVar16) / 1000000000.0;
  cmDurationTo<unsigned_int>(local_db8);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,"s)");
  std::endl<char,std::char_traits<char>>(poVar12);
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x4eb,(char *)local_db8[0].__r,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  std::__cxx11::string::~string((string *)local_db8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)log,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  this->DefectCount = this->DefectCount + iVar10;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&nonMemcheckOutput.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            (&false_positive_matchers);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            (&matchers);
  cmsys::RegularExpression::~RegularExpression(&leakExpr);
  cmsys::RegularExpression::~RegularExpression(&memcheckLine);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lines);
  return iVar10 == 0;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckCudaOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  bool unlimitedOutput = false;
  if (str.find("CTEST_FULL_OUTPUT") != std::string::npos ||
      this->CustomMaximumFailedTestOutputSize == 0) {
    unlimitedOutput = true;
  }

  std::string::size_type cc;

  std::ostringstream ostr;
  log.clear();

  int defects = 0;

  cmsys::RegularExpression memcheckLine("^========");

  cmsys::RegularExpression leakExpr("== Leaked [0-9,]+ bytes at");

  // list of matchers for output messages that contain variable content
  // (addresses, sizes, ...) or can be shortened in general. the first match is
  // used as a error name.
  std::vector<cmsys::RegularExpression> matchers{
    // API errors
    "== Malloc/Free error encountered: (.*)",
    "== Program hit error ([^ ]*).* on CUDA API call to",
    "== Program hit ([^ ]*).* on CUDA API call to",
    // memcheck
    "== (Invalid .*) of size [0-9,]+", "== (Fatal UVM [CG]PU fault)",
    // racecheck
    "== .* (Potential .* hazard detected)", "== .* (Race reported)",
    // synccheck
    "== (Barrier error)",
    // initcheck
    "== (Uninitialized .* memory read)", "== (Unused memory)",
    "== (Host API memory access error)",
    // generic error: ignore ERROR SUMMARY, CUDA-MEMCHECK and others
    "== ([A-Z][a-z].*)"
  };
  // matchers for messages that aren't defects, but caught by above matchers
  std::vector<cmsys::RegularExpression> false_positive_matchers{
    "== Error: No attachable process found.*timed-out",
    "== Default timeout can be adjusted with --launch-timeout",
    "== Error: Target application terminated before first instrumented API",
    "== Tracking kernels launched by child processes requires"
  };

  std::vector<std::string::size_type> nonMemcheckOutput;
  auto sttime = std::chrono::steady_clock::now();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Start test: " << lines.size() << std::endl, this->Quiet);
  std::string::size_type totalOutputSize = 0;
  for (cc = 0; cc < lines.size(); cc++) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "test line " << lines[cc] << std::endl, this->Quiet);

    if (memcheckLine.find(lines[cc])) {
      cmCTestOptionalLog(this->CTest, DEBUG,
                         "cuda sanitizer line " << lines[cc] << std::endl,
                         this->Quiet);
      int failure = -1;
      auto& line = lines[cc];
      if (leakExpr.find(line)) {
        failure = static_cast<int>(this->FindOrAddWarning("Memory leak"));
      } else {
        auto match_predicate =
          [&line](cmsys::RegularExpression& matcher) -> bool {
          return matcher.find(line);
        };
        auto const pos_matcher =
          std::find_if(matchers.begin(), matchers.end(), match_predicate);
        if (pos_matcher != matchers.end()) {
          if (!std::any_of(false_positive_matchers.begin(),
                           false_positive_matchers.end(), match_predicate)) {
            failure =
              static_cast<int>(this->FindOrAddWarning(pos_matcher->match(1)));
          }
        }
      }

      if (failure >= 0) {
        ostr << "<b>" << this->ResultStrings[failure] << "</b> ";
        if (results.empty() ||
            static_cast<unsigned>(failure) > results.size() - 1) {
          results.push_back(1);
        } else {
          results[failure]++;
        }
        defects++;
      }
      totalOutputSize += lines[cc].size();
      ostr << lines[cc] << std::endl;
    } else {
      nonMemcheckOutput.push_back(cc);
    }
  }
  // Now put all all the non cuda sanitizer output into the test output
  // This should be last in case it gets truncated by the output
  // limiting code
  for (std::string::size_type i : nonMemcheckOutput) {
    totalOutputSize += lines[i].size();
    ostr << lines[i] << std::endl;
    if (!unlimitedOutput &&
        totalOutputSize >
          static_cast<size_t>(this->CustomMaximumFailedTestOutputSize)) {
      ostr << "....\n";
      ostr << "Test Output for this test has been truncated see testing"
              " machine logs for full output,\n";
      ostr << "or put CTEST_FULL_OUTPUT in the output of "
              "this test program.\n";
      break; // stop the copy of output if we are full
    }
  }
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "End test (elapsed: "
                       << cmDurationTo<unsigned int>(
                            std::chrono::steady_clock::now() - sttime)
                       << "s)" << std::endl,
                     this->Quiet);
  log = ostr.str();
  this->DefectCount += defects;
  return defects == 0;
}